

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_dense.cpp
# Opt level: O1

int main(void)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  int testCase;
  int local_c;
  
  std::istream::operator>>((istream *)&std::cin,&local_c);
  bVar1 = runCase(local_c);
  if (bVar1) {
    pcVar3 = "YES!$@*";
    lVar2 = 7;
  }
  else {
    pcVar3 = "NO";
    lVar2 = 2;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar3,lVar2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  return 0;
}

Assistant:

int main() {
    int testCase;
    cin>>testCase;
    if (runCase(testCase)) {
        cout<<"YES!$@*"<<endl;
    } else {
        cout<<"NO"<<endl;
    }
    return 0;
}